

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes_parser.cc
# Opt level: O0

bool __thiscall
libwebm::VpxPesParser::ParseNextPacket(VpxPesParser *this,PesHeader *header,VideoFrame *frame)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  Buffer *pBVar8;
  int64_t nano_pts;
  pointer __dest;
  size_t local_40;
  size_t consumed;
  size_t payload_length;
  size_t packet_start_pos;
  VideoFrame *frame_local;
  PesHeader *header_local;
  VpxPesParser *this_local;
  
  if ((((header == (PesHeader *)0x0) || (frame == (VideoFrame *)0x0)) ||
      (*(int *)(this + 0x78) != 0)) ||
     (packet_start_pos = (size_t)frame, frame_local = (VideoFrame *)header,
     header_local = (PesHeader *)this, iVar3 = BytesAvailable(this), iVar3 == 0)) {
    this_local._7_1_ = false;
  }
  else {
    payload_length = *(size_t *)(this + 0x70);
    bVar2 = FindStartCode(this,*(size_t *)(this + 0x70),&payload_length);
    if (bVar2) {
      *(undefined4 *)(this + 0x78) = 1;
      *(size_t *)(this + 0x70) = payload_length;
      bVar2 = ParsePesHeader(this,(PesHeader *)frame_local);
      if (bVar2) {
        bVar2 = ParsePesOptionalHeader(this,(PesOptionalHeader *)&(frame_local->buffer_).length);
        if (bVar2) {
          bVar2 = ParseBcmvHeader(this,(BcmvHeader *)&frame_local[1].keyframe_);
          if (bVar2) {
            uVar1 = *(uint *)&frame_local[1].field_0x1c;
            sVar4 = BcmvHeader::size();
            consumed = uVar1 - sVar4;
            uVar5 = *(long *)(this + 0x70) + consumed;
            sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               (this + 0x58));
            sVar4 = consumed;
            if (sVar6 < uVar5) {
              sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 (this + 0x58));
              printf("VpxPesParser: Not enough data. Required: %u Available: %u\n",
                     sVar4 & 0xffffffff,
                     (ulong)(uint)((int)sVar6 - (int)*(undefined8 *)(this + 0x70)));
              *(undefined4 *)(this + 0x78) = 0;
              *(size_t *)(this + 0x70) = payload_length;
              this_local._7_1_ = false;
            }
            else {
              bVar2 = IsPayloadFragmented(this,(PesHeader *)frame_local);
              if (bVar2) {
                bVar2 = AccumulateFragmentedPayload
                                  (this,(ulong)*(ushort *)
                                                ((long)&(frame_local->buffer_).data._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                                  .super__Head_base<0UL,_unsigned_char_*,_false> + 4
                                                ),consumed);
                if (!bVar2) {
                  fprintf(_stderr,"VpxPesParser: Failed parsing fragmented payload!\n");
                  return false;
                }
              }
              else {
                local_40 = 0;
                pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    (this + 0x58),*(size_type *)(this + 0x70));
                bVar2 = RemoveStartCodeEmulationPreventionBytes
                                  (this,pvVar7,consumed,(PacketData *)(this + 0x40),&local_40);
                if (!bVar2) {
                  return false;
                }
                *(size_t *)(this + 0x70) = local_40 + *(long *)(this + 0x70);
              }
              pBVar8 = VideoFrame::buffer((VideoFrame *)packet_start_pos);
              uVar5 = pBVar8->capacity;
              sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 (this + 0x40));
              sVar4 = packet_start_pos;
              if (uVar5 < sVar6) {
                sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   (this + 0x40));
                bVar2 = VideoFrame::Init((VideoFrame *)sVar4,sVar6);
                if (!bVar2) {
                  fprintf(_stderr,"VpxPesParser: Out of memory.\n");
                  return false;
                }
              }
              sVar4 = packet_start_pos;
              nano_pts = Khz90TicksToNanoseconds(frame_local[1].buffer_.length);
              VideoFrame::set_nanosecond_pts((VideoFrame *)sVar4,nano_pts);
              pBVar8 = VideoFrame::buffer((VideoFrame *)packet_start_pos);
              __dest = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                                 (&pBVar8->data);
              pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  (this + 0x40),0);
              sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 (this + 0x40));
              memcpy(__dest,pvVar7,sVar6);
              sVar4 = packet_start_pos;
              sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 (this + 0x40));
              VideoFrame::SetBufferLength((VideoFrame *)sVar4,sVar6);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x40));
              *(undefined4 *)(this + 0x78) = 0;
              this_local._7_1_ = true;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool VpxPesParser::ParseNextPacket(PesHeader* header, VideoFrame* frame) {
  if (!header || !frame || parse_state_ != kFindStartCode ||
      BytesAvailable() == 0) {
    return false;
  }

  std::size_t packet_start_pos = read_pos_;
  if (!FindStartCode(read_pos_, &packet_start_pos)) {
    return false;
  }
  parse_state_ = kParsePesHeader;
  read_pos_ = packet_start_pos;

  if (!ParsePesHeader(header)) {
    return false;
  }
  if (!ParsePesOptionalHeader(&header->opt_header)) {
    return false;
  }
  if (!ParseBcmvHeader(&header->bcmv_header)) {
    return false;
  }

  // BCMV header length includes the length of the BCMVHeader itself. Adjust:
  const std::size_t payload_length =
      header->bcmv_header.length - BcmvHeader::size();

  // Make sure there's enough input data to read the entire frame.
  if (read_pos_ + payload_length > pes_file_data_.size()) {
    // Need more data.
    printf("VpxPesParser: Not enough data. Required: %u Available: %u\n",
           static_cast<unsigned int>(payload_length),
           static_cast<unsigned int>(pes_file_data_.size() - read_pos_));
    parse_state_ = kFindStartCode;
    read_pos_ = packet_start_pos;
    return false;
  }

  if (IsPayloadFragmented(*header)) {
    if (!AccumulateFragmentedPayload(header->packet_length, payload_length)) {
      fprintf(stderr, "VpxPesParser: Failed parsing fragmented payload!\n");
      return false;
    }
  } else {
    std::size_t consumed = 0;
    if (!RemoveStartCodeEmulationPreventionBytes(
            &pes_file_data_[read_pos_], payload_length, &payload_, &consumed)) {
      return false;
    }
    read_pos_ += consumed;
  }

  if (frame->buffer().capacity < payload_.size()) {
    if (frame->Init(payload_.size()) == false) {
      fprintf(stderr, "VpxPesParser: Out of memory.\n");
      return false;
    }
  }
  frame->set_nanosecond_pts(Khz90TicksToNanoseconds(header->opt_header.pts));
  std::memcpy(frame->buffer().data.get(), &payload_[0], payload_.size());
  frame->SetBufferLength(payload_.size());

  payload_.clear();
  parse_state_ = kFindStartCode;

  return true;
}